

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void emit_GLSL_dotprod(Context *ctx,char *src0,char *src1,char *extra)

{
  uint uVar1;
  char *pcVar2;
  char castleft [16];
  char code [128];
  
  uVar1 = (ctx->dest_arg).writemask;
  castleft[0] = '\0';
  castleft[1] = '\0';
  castleft[2] = '\0';
  castleft[3] = '\0';
  castleft[4] = '\0';
  castleft[5] = '\0';
  castleft[6] = '\0';
  castleft[7] = '\0';
  castleft[8] = '\0';
  castleft[9] = '\0';
  castleft[10] = '\0';
  castleft[0xb] = '\0';
  castleft[0xc] = '\0';
  castleft[0xd] = '\0';
  castleft[0xe] = '\0';
  castleft[0xf] = '\0';
  if ((uVar1 >> 2 & 1) + (uVar1 & 1) + (uint)((uVar1 >> 1 & 1) != 0) + (uint)((uVar1 >> 3 & 1) != 0)
      == 1) {
    pcVar2 = "";
  }
  else {
    snprintf(castleft,0x10,"vec%d(");
    pcVar2 = ")";
  }
  make_GLSL_destarg_assign(ctx,code,0x80,"%sdot(%s, %s)%s%s",castleft,src0,src1,extra,pcVar2);
  output_line(ctx,"%s",code);
  return;
}

Assistant:

static void emit_GLSL_dotprod(Context *ctx, const char *src0, const char *src1,
                              const char *extra)
{
    const int vecsize = vecsize_from_writemask(ctx->dest_arg.writemask);
    char castleft[16] = { '\0' };
    const char *castright = "";
    if (vecsize != 1)
    {
        snprintf(castleft, sizeof (castleft), "vec%d(", vecsize);
        castright = ")";
    } // if

    char code[128];
    make_GLSL_destarg_assign(ctx, code, sizeof (code), "%sdot(%s, %s)%s%s",
                             castleft, src0, src1, extra, castright);
    output_line(ctx, "%s", code);
}